

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O0

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  FieldDescriptor *this;
  bool bVar1;
  CppType CVar2;
  int iVar3;
  UnknownFieldSet *this_00;
  reference ppFVar4;
  MapFieldBase *this_01;
  MapValueRef *this_02;
  Message *pMVar5;
  int local_100;
  int j;
  int size;
  MapIterator end;
  MapIterator iter;
  MapFieldBase *map_field;
  FieldDescriptor *field;
  iterator __end2;
  iterator __begin2;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *__range2;
  undefined1 local_30 [8];
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  Reflection *reflection;
  Message *message_local;
  
  fields.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)GetReflectionOrDie(message);
  this_00 = Reflection::MutableUnknownFields
                      ((Reflection *)
                       fields.
                       super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage,message);
  UnknownFieldSet::Clear(this_00);
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            *)local_30);
  Reflection::ListFields
            ((Reflection *)
             fields.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,
             (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              *)local_30);
  __end2 = std::
           vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
           ::begin((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)local_30);
  field = (FieldDescriptor *)
          std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::end((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 *)local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
                                     *)&field), bVar1) {
    ppFVar4 = __gnu_cxx::
              __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
              ::operator*(&__end2);
    this = *ppFVar4;
    CVar2 = FieldDescriptor::cpp_type(this);
    if (CVar2 == CPPTYPE_MESSAGE) {
      bVar1 = FieldDescriptor::is_map(this);
      if ((bVar1) && (bVar1 = IsMapValueMessageTyped(this), bVar1)) {
        this_01 = Reflection::MutableMapData
                            ((Reflection *)
                             fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this);
        bVar1 = MapFieldBase::IsMapValid(this_01);
        if (bVar1) {
          MapIterator::MapIterator
                    ((MapIterator *)&end.value_.super_MapValueConstRef.type_,message,this);
          MapIterator::MapIterator((MapIterator *)&j,message,this);
          (*this_01->_vptr_MapFieldBase[7])(this_01,&end.value_.super_MapValueConstRef.type_);
          (*this_01->_vptr_MapFieldBase[8])(this_01,&j);
          while (bVar1 = protobuf::operator!=
                                   ((MapIterator *)&end.value_.super_MapValueConstRef.type_,
                                    (MapIterator *)&j), bVar1) {
            this_02 = MapIterator::MutableValueRef
                                ((MapIterator *)&end.value_.super_MapValueConstRef.type_);
            pMVar5 = MapValueRef::MutableMessageValue(this_02);
            Message::DiscardUnknownFields(pMVar5);
            MapIterator::operator++((MapIterator *)&end.value_.super_MapValueConstRef.type_);
          }
          MapIterator::~MapIterator((MapIterator *)&j);
          MapIterator::~MapIterator((MapIterator *)&end.value_.super_MapValueConstRef.type_);
        }
      }
      else {
        bVar1 = FieldDescriptor::is_repeated(this);
        if (bVar1) {
          iVar3 = Reflection::FieldSize
                            ((Reflection *)
                             fields.
                             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this);
          for (local_100 = 0; local_100 < iVar3; local_100 = local_100 + 1) {
            pMVar5 = Reflection::MutableRepeatedMessage
                               ((Reflection *)
                                fields.
                                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this,
                                local_100);
            Message::DiscardUnknownFields(pMVar5);
          }
        }
        else {
          pMVar5 = Reflection::MutableMessage
                             ((Reflection *)
                              fields.
                              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,message,this,
                              (MessageFactory *)0x0);
          Message::DiscardUnknownFields(pMVar5);
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_google::protobuf::FieldDescriptor_**,_std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>
    ::operator++(&__end2);
  }
  std::
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ::~vector((vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             *)local_30);
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  reflection->MutableUnknownFields(message)->Clear();

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    if (field->is_map() && IsMapValueMessageTyped(field)) {
      const MapFieldBase* map_field =
          reflection->MutableMapData(message, field);
      if (map_field->IsMapValid()) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}